

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O2

void P_AdjustLine(line_t *ld)

{
  double dVar1;
  vertex_t *pvVar2;
  vertex_t *pvVar3;
  vertex_t *pvVar4;
  double dVar5;
  
  pvVar2 = ld->v1;
  pvVar3 = ld->v2;
  dVar5 = (pvVar3->p).Y;
  dVar1 = (pvVar2->p).Y;
  (ld->delta).X = (pvVar3->p).X - (pvVar2->p).X;
  (ld->delta).Y = dVar5 - dVar1;
  dVar5 = (pvVar2->p).X;
  dVar1 = (pvVar3->p).X;
  pvVar4 = pvVar3;
  if (dVar1 <= dVar5) {
    dVar5 = dVar1;
    pvVar4 = pvVar2;
  }
  ld->bbox[2] = dVar5;
  ld->bbox[3] = (pvVar4->p).X;
  dVar5 = (pvVar2->p).Y;
  dVar1 = (pvVar3->p).Y;
  if (dVar5 < dVar1) {
    pvVar2 = pvVar3;
  }
  if (dVar1 <= dVar5) {
    dVar5 = dVar1;
  }
  ld->bbox[1] = dVar5;
  ld->bbox[0] = (pvVar2->p).Y;
  return;
}

Assistant:

void P_AdjustLine (line_t *ld)
{
	vertex_t *v1, *v2;

	v1 = ld->v1;
	v2 = ld->v2;

	ld->setDelta(v2->fX() - v1->fX(), v2->fY() - v1->fY());
	
	if (v1->fX() < v2->fX())
	{
		ld->bbox[BOXLEFT] = v1->fX();
		ld->bbox[BOXRIGHT] = v2->fX();
	}
	else
	{
		ld->bbox[BOXLEFT] = v2->fX();
		ld->bbox[BOXRIGHT] = v1->fX();
	}

	if (v1->fY() < v2->fY())
	{
		ld->bbox[BOXBOTTOM] = v1->fY();
		ld->bbox[BOXTOP] = v2->fY();
	}
	else
	{
		ld->bbox[BOXBOTTOM] = v2->fY();
		ld->bbox[BOXTOP] = v1->fY();
	}
}